

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int b;
  undefined8 *puVar1;
  stbi__uint32 a;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  void *pvVar11;
  ulong uVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  stbi_uc **ppsVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int *piVar20;
  int iVar21;
  long in_FS_OFFSET;
  
  s = z->s;
  sVar2 = stbi__get8(s);
  sVar3 = stbi__get8(s);
  if (10 < CONCAT11(sVar2,sVar3)) {
    sVar4 = stbi__get8(s);
    if (sVar4 != '\b') {
      pcVar10 = "only 8-bit";
      goto LAB_001113a6;
    }
    sVar4 = stbi__get8(s);
    sVar5 = stbi__get8(s);
    s->img_y = (uint)CONCAT11(sVar4,sVar5);
    if (CONCAT11(sVar4,sVar5) == 0) {
      pcVar10 = "no header height";
      goto LAB_001113a6;
    }
    sVar4 = stbi__get8(s);
    sVar5 = stbi__get8(s);
    s->img_x = (uint)CONCAT11(sVar4,sVar5);
    if (CONCAT11(sVar4,sVar5) == 0) {
      pcVar10 = "0 width";
      goto LAB_001113a6;
    }
    if (0x1000000 < s->img_y) {
      pcVar10 = "too large";
      goto LAB_001113a6;
    }
    bVar6 = stbi__get8(s);
    if ((4 < bVar6) || ((0x1aU >> (bVar6 & 0x1f) & 1) == 0)) {
      pcVar10 = "bad component count";
      goto LAB_001113a6;
    }
    s->img_n = (uint)bVar6;
    uVar12 = (ulong)bVar6;
    ppsVar13 = &z->img_comp[0].data;
    do {
      *ppsVar13 = (stbi_uc *)0x0;
      ppsVar13[3] = (stbi_uc *)0x0;
      ppsVar13 = ppsVar13 + 0xc;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    if (CONCAT11(sVar2,sVar3) == (ushort)((ushort)bVar6 + (ushort)bVar6 * 2 + 8)) {
      z->rgb = 0;
      piVar20 = &z->img_comp[0].tq;
      lVar18 = 0;
      do {
        bVar6 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar20 + -3))->id = (uint)bVar6;
        if ((s->img_n == 3) && (bVar6 == "RGB"[lVar18])) {
          z->rgb = z->rgb + 1;
        }
        bVar6 = stbi__get8(s);
        piVar20[-2] = (uint)(bVar6 >> 4);
        if ((byte)(bVar6 + 0xb0) < 0xc0) goto LAB_00111725;
        piVar20[-1] = bVar6 & 0xf;
        if ((bVar6 & 0xf) - 5 < 0xfffffffc) goto LAB_00111731;
        bVar6 = stbi__get8(s);
        *piVar20 = (uint)bVar6;
        if (3 < bVar6) {
          pcVar10 = "bad TQ";
          goto LAB_001113a6;
        }
        lVar18 = lVar18 + 1;
        iVar9 = s->img_n;
        lVar16 = (long)iVar9;
        piVar20 = piVar20 + 0x18;
      } while (lVar18 < lVar16);
      if (scan != 0) {
        return 1;
      }
      a = s->img_x;
      b_00 = s->img_y;
      iVar7 = stbi__mad3sizes_valid(a,b_00,iVar9,0);
      if (iVar7 == 0) {
        *(char **)(in_FS_OFFSET + -0x20) = "too large";
        return 0;
      }
      uVar14 = 1;
      uVar17 = 1;
      if (0 < iVar9) {
        uVar14 = 1;
        lVar18 = 0;
        uVar17 = 1;
        do {
          uVar8 = *(uint *)((long)&z->img_comp[0].h + lVar18);
          uVar15 = *(uint *)((long)&z->img_comp[0].v + lVar18);
          if ((int)uVar17 < (int)uVar8) {
            uVar17 = uVar8;
          }
          if ((int)uVar14 < (int)uVar15) {
            uVar14 = uVar15;
          }
          lVar18 = lVar18 + 0x60;
        } while (lVar16 * 0x60 != lVar18);
        if (0 < iVar9) {
          lVar18 = 0;
          do {
            if ((int)uVar17 % *(int *)((long)&z->img_comp[0].h + lVar18) != 0) goto LAB_00111725;
            if ((int)uVar14 % *(int *)((long)&z->img_comp[0].v + lVar18) != 0) goto LAB_00111731;
            lVar18 = lVar18 + 0x60;
          } while (lVar16 * 0x60 != lVar18);
        }
      }
      uVar15 = ((a + uVar17 * 8) - 1) / (uVar17 * 8);
      uVar8 = ((b_00 + uVar14 * 8) - 1) / (uVar14 * 8);
      z->img_h_max = uVar17;
      z->img_v_max = uVar14;
      z->img_mcu_w = uVar17 * 8;
      z->img_mcu_h = uVar14 * 8;
      z->img_mcu_x = uVar15;
      z->img_mcu_y = uVar8;
      if (iVar9 < 1) {
        return 1;
      }
      iVar9 = 1;
      lVar18 = 0;
      while( true ) {
        iVar19 = *(int *)((long)&z->img_comp[0].h + lVar18);
        iVar21 = *(int *)((long)&z->img_comp[0].v + lVar18);
        *(uint *)((long)&z->img_comp[0].x + lVar18) = (iVar19 * a + (uVar17 - 1)) / uVar17;
        *(uint *)((long)&z->img_comp[0].y + lVar18) = (iVar21 * b_00 + (uVar14 - 1)) / uVar14;
        iVar19 = iVar19 * uVar15;
        iVar7 = iVar19 * 8;
        *(int *)((long)&z->img_comp[0].w2 + lVar18) = iVar7;
        iVar21 = iVar21 * uVar8;
        b = iVar21 * 8;
        *(int *)((long)&z->img_comp[0].h2 + lVar18) = b;
        pvVar11 = stbi__malloc_mad2(iVar7,b,0xf);
        puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar18);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar18) = 0;
        *(void **)((long)&z->img_comp[0].raw_data + lVar18) = pvVar11;
        why = extraout_EDX;
        if (pvVar11 == (void *)0x0) break;
        *(ulong *)((long)&z->img_comp[0].data + lVar18) = (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
        if (z->progressive != 0) {
          *(int *)((long)&z->img_comp[0].coeff_w + lVar18) = iVar19;
          *(int *)((long)&z->img_comp[0].coeff_h + lVar18) = iVar21;
          pvVar11 = stbi__malloc_mad3(iVar7,b,2,0xf);
          *(void **)((long)&z->img_comp[0].raw_coeff + lVar18) = pvVar11;
          why = extraout_EDX_00;
          if (pvVar11 == (void *)0x0) break;
          *(ulong *)((long)&z->img_comp[0].coeff + lVar18) =
               (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
        }
        iVar9 = iVar9 + 1;
        lVar18 = lVar18 + 0x60;
        if (lVar16 * 0x60 == lVar18) {
          return 1;
        }
      }
      *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
      stbi__free_jpeg_components(z,iVar9,why);
      return 0;
    }
  }
  pcVar10 = "bad SOF len";
  goto LAB_001113a6;
LAB_00111725:
  pcVar10 = "bad H";
  goto LAB_001113a6;
LAB_00111731:
  pcVar10 = "bad V";
LAB_001113a6:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar10;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}